

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O1

Vec_Wrd_t * Zyx_TestCreateTruthTables(int nVars,int nNodes)

{
  word wVar1;
  uint uVar2;
  Vec_Wrd_t *pVVar3;
  word *__s;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  int nWords;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  
  bVar4 = (byte)(nVars - 6U);
  __s = (word *)0x0;
  uVar2 = 1 << (bVar4 & 0x1f);
  if (nVars < 7) {
    uVar2 = 1;
  }
  if (nVars < 7) {
    bVar4 = 0;
  }
  iVar9 = nVars + 1 + nNodes << (bVar4 & 0x1f);
  pVVar3 = (Vec_Wrd_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar5 = iVar9;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar5;
  if (iVar5 != 0) {
    __s = (word *)malloc((long)iVar5 << 3);
  }
  pVVar3->pArray = __s;
  pVVar3->nSize = iVar9;
  uVar10 = 0;
  memset(__s,0,(long)iVar9 << 3);
  if (0 < nVars) {
    uVar6 = (ulong)(nVars - 6U);
    if (nVars < 7) {
      uVar6 = uVar10;
    }
    do {
      bVar4 = (byte)uVar6 & 0x1f;
      uVar7 = (int)uVar10 << bVar4;
      if (((int)uVar10 << bVar4 < 0) || (iVar9 <= (int)uVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      if (uVar10 < 6) {
        if (0 < (int)uVar2) {
          wVar1 = s_Truths6[uVar10];
          uVar8 = 0;
          do {
            __s[uVar7 + uVar8] = wVar1;
            uVar8 = uVar8 + 1;
          } while (uVar2 != uVar8);
        }
      }
      else if (0 < (int)uVar2) {
        uVar8 = 0;
        do {
          __s[uVar7 + uVar8] = -(ulong)((1 << ((char)uVar10 - 6U & 0x1f) & (uint)uVar8) != 0);
          uVar8 = uVar8 + 1;
        } while (uVar2 != uVar8);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != (uint)nVars);
  }
  return pVVar3;
}

Assistant:

Vec_Wrd_t * Zyx_TestCreateTruthTables( int nVars, int nNodes )
{
    int i, nWords = Abc_TtWordNum(nVars);
    Vec_Wrd_t * vInfo = Vec_WrdStart( nWords * (nVars + nNodes + 1) ); 
    for ( i = 0; i < nVars; i++ )
        Abc_TtIthVar( Zyx_TestTruth(vInfo, i, nWords), i, nVars );
    //Dau_DsdPrintFromTruth( Maj3_ManTruth(p, p->nObjs), p->nVars );
    return vInfo;
}